

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshUtilities.cpp
# Opt level: O0

void Rml::MeshUtilities::GenerateBackground
               (Mesh *out_mesh,RenderBox *render_box,ColourbPremultiplied color)

{
  Vector<int> *this;
  Vector2f inner_size;
  size_type sVar1;
  Vector2f outer_position;
  EdgeSizes edge_sizes;
  CornerSizes outer_radii_def;
  bool local_115;
  undefined1 local_110 [8];
  GeometryBackgroundBorder geometry;
  Vector<int> *indices;
  Vector<Vertex> *vertices;
  undefined1 local_bc [8];
  BorderMetrics metrics;
  float fStack_24;
  bool has_background;
  Vector2f fill_size;
  RenderBox *render_box_local;
  Mesh *out_mesh_local;
  ColourbPremultiplied color_local;
  
  register0x00001200 = RenderBox::GetFillSize(render_box);
  out_mesh_local._7_1_ = color.alpha;
  local_115 = false;
  if (out_mesh_local._7_1_ != '\0') {
    local_115 = false;
    if (0.0 < metrics.inner_radii._M_elems[3].y) {
      local_115 = 0.0 < fStack_24;
    }
  }
  metrics.inner_radii._M_elems[3].x._3_1_ = local_115;
  if (local_115 != false) {
    outer_position = RenderBox::GetBorderOffset(render_box);
    edge_sizes = RenderBox::GetBorderWidths(render_box);
    inner_size = stack0xffffffffffffffd8;
    outer_radii_def = RenderBox::GetBorderRadius(render_box);
    GeometryBackgroundBorder::ComputeBorderMetrics
              ((BorderMetrics *)local_bc,outer_position,edge_sizes,inner_size,outer_radii_def);
    geometry.indices = &out_mesh->indices;
    sVar1 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::size(&out_mesh->vertices);
    ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::reserve
              (&out_mesh->vertices,(long)((int)sVar1 + 4));
    this = geometry.indices;
    sVar1 = ::std::vector<int,_std::allocator<int>_>::size(geometry.indices);
    ::std::vector<int,_std::allocator<int>_>::reserve(this,(long)((int)sVar1 + 6));
    GeometryBackgroundBorder::GeometryBackgroundBorder
              ((GeometryBackgroundBorder *)local_110,&out_mesh->vertices,geometry.indices);
    GeometryBackgroundBorder::DrawBackground
              ((GeometryBackgroundBorder *)local_110,(BorderMetrics *)local_bc,color);
  }
  return;
}

Assistant:

void MeshUtilities::GenerateBackground(Mesh& out_mesh, const RenderBox& render_box, ColourbPremultiplied color)
{
	const Vector2f fill_size = render_box.GetFillSize();
	const bool has_background = (color.alpha > 0 && fill_size.x > 0 && fill_size.y > 0);
	if (!has_background)
		return;

	const BorderMetrics metrics = GeometryBackgroundBorder::ComputeBorderMetrics(render_box.GetBorderOffset(), render_box.GetBorderWidths(),
		fill_size, render_box.GetBorderRadius());

	Vector<Vertex>& vertices = out_mesh.vertices;
	Vector<int>& indices = out_mesh.indices;

	// Reserve geometry. A conservative estimate, does not take border-radii into account.
	vertices.reserve((int)vertices.size() + 4);
	indices.reserve((int)indices.size() + 6);

	// Generate the geometry
	GeometryBackgroundBorder geometry(vertices, indices);
	geometry.DrawBackground(metrics, color);
}